

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.hpp
# Opt level: O2

void __thiscall
helics::BasicBrokerInfo::BasicBrokerInfo(BasicBrokerInfo *this,string_view brokerName)

{
  allocator<char> local_19;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  local_18._M_str = brokerName._M_str;
  local_18._M_len = brokerName._M_len;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)this,&local_18,&local_19);
  this->global_id = -2010000000;
  this->route = -0x4d3263e0;
  (this->parent).gid = -2010000000;
  this->initIterating = false;
  this->state = CONNECTED;
  this->_hasTimeDependency = false;
  this->_core = false;
  this->_nonLocal = false;
  this->_route_key = false;
  this->_sent_disconnect_ack = false;
  this->_disable_ping = false;
  this->_observer = false;
  (this->routeInfo)._M_dataplus._M_p = (pointer)&(this->routeInfo).field_2;
  (this->routeInfo)._M_string_length = 0;
  (this->routeInfo).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

explicit BasicBrokerInfo(std::string_view brokerName): name(brokerName) {}